

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::cast_to_variable_store
          (CompilerGLSL *this,uint32_t target_id,string *expr,SPIRType *expr_type)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRVariable *pSVar3;
  string sStack_1a8;
  SPIRType type;
  
  pSVar3 = Compiler::maybe_get_backing_variable(&this->super_Compiler,target_id);
  if (pSVar3 != (SPIRVariable *)0x0) {
    target_id = (pSVar3->super_IVariant).self.id;
  }
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)target_id,BuiltIn);
  if (bVar1) {
    uVar2 = Compiler::get_decoration(&this->super_Compiler,(ID)target_id,BuiltIn);
    type.basetype =
         (*(this->super_Compiler)._vptr_Compiler[0x3f])
                   (this,(ulong)uVar2,(ulong)expr_type->basetype);
    if (type.basetype != expr_type->basetype) {
      SPIRType::SPIRType(&type,expr_type);
      bitcast_expression(&sStack_1a8,this,&type,expr_type->basetype,expr);
      ::std::__cxx11::string::operator=((string *)expr,(string *)&sStack_1a8);
      ::std::__cxx11::string::~string((string *)&sStack_1a8);
      SPIRType::~SPIRType(&type);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::cast_to_variable_store(uint32_t target_id, std::string &expr, const SPIRType &expr_type)
{
	auto *var = maybe_get_backing_variable(target_id);
	if (var)
		target_id = var->self;

	// Only interested in standalone builtin variables.
	if (!has_decoration(target_id, DecorationBuiltIn))
		return;

	auto builtin = static_cast<BuiltIn>(get_decoration(target_id, DecorationBuiltIn));
	auto expected_type = get_builtin_basetype(builtin, expr_type.basetype);

	if (expected_type != expr_type.basetype)
	{
		auto type = expr_type;
		type.basetype = expected_type;
		expr = bitcast_expression(type, expr_type.basetype, expr);
	}
}